

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::SetItem
               (Var receiver,RecyclableObject *object,uint64 index,Var value,
               ScriptContext *scriptContext,PropertyOperationFlags propertyOperationFlags)

{
  BOOL BVar1;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  
  local_40 = (PropertyRecord *)0x0;
  propertyRecord._4_4_ = propertyOperationFlags;
  GetPropertyIdForInt(index,scriptContext,&local_40);
  BVar1 = SetProperty(receiver,object,local_40->pid,value,scriptContext,propertyRecord._4_4_);
  return BVar1;
}

Assistant:

BOOL JavascriptOperators::SetItem(Var receiver, RecyclableObject* object, uint64 index, Var value, ScriptContext* scriptContext, PropertyOperationFlags propertyOperationFlags)
    {
        PropertyRecord const * propertyRecord = nullptr;
        JavascriptOperators::GetPropertyIdForInt(index, scriptContext, &propertyRecord);
        return JavascriptOperators::SetProperty(receiver, object, propertyRecord->GetPropertyId(), value, scriptContext, propertyOperationFlags);
    }